

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  _func_int **pp_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  _func_int *p_Var20;
  uint uVar21;
  int iVar22;
  long lVar23;
  
  iVar14 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar14 == 2) {
      iVar16 = bottom_top_blob->h;
      if ((long)iVar16 < 1) {
        return 0;
      }
      iVar19 = bottom_top_blob->w;
      pp_Var6 = this->_vptr_BatchNorm_x86;
      lVar17 = 0;
      do {
        if (0 < iVar19) {
          pfVar18 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar17 * 0x10);
          fVar4 = *pfVar18;
          fVar5 = pfVar18[1];
          fVar7 = pfVar18[2];
          fVar8 = pfVar18[3];
          pfVar18 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar17 * 0x10);
          fVar9 = *pfVar18;
          fVar10 = pfVar18[1];
          fVar11 = pfVar18[2];
          fVar12 = pfVar18[3];
          pfVar18 = (float *)(bottom_top_blob->w * lVar17 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar22 = iVar19;
          do {
            *pfVar18 = *pfVar18 * fVar9 + fVar4;
            pfVar18[1] = pfVar18[1] * fVar10 + fVar5;
            pfVar18[2] = pfVar18[2] * fVar11 + fVar7;
            pfVar18[3] = pfVar18[3] * fVar12 + fVar8;
            pfVar18 = pfVar18 + 4;
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar16);
    }
    else if (iVar14 == 1) {
      iVar16 = bottom_top_blob->w;
      if ((long)iVar16 < 1) {
        return 0;
      }
      pp_Var6 = this->_vptr_BatchNorm_x86;
      lVar17 = 0;
      do {
        pfVar18 = (float *)((long)bottom_top_blob->data + lVar17);
        fVar4 = pfVar18[1];
        fVar5 = pfVar18[2];
        fVar7 = pfVar18[3];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar17);
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar17);
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = (float *)((long)bottom_top_blob->data + lVar17);
        *pfVar3 = *pfVar18 * *pfVar1 + *pfVar2;
        pfVar3[1] = fVar4 * fVar8 + fVar11;
        pfVar3[2] = fVar5 * fVar9 + fVar12;
        pfVar3[3] = fVar7 * fVar10 + fVar13;
        lVar17 = lVar17 + 0x10;
      } while ((long)iVar16 * 0x10 != lVar17);
    }
    if ((iVar14 - 3U < 2) && (iVar14 = bottom_top_blob->c, 0 < (long)iVar14)) {
      iVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var6 = this->_vptr_BatchNorm_x86;
      lVar17 = 0;
      do {
        if (0 < iVar16) {
          pfVar18 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar17 * 0x10);
          fVar4 = *pfVar18;
          fVar5 = pfVar18[1];
          fVar7 = pfVar18[2];
          fVar8 = pfVar18[3];
          pfVar18 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar17 * 0x10);
          fVar9 = *pfVar18;
          fVar10 = pfVar18[1];
          fVar11 = pfVar18[2];
          fVar12 = pfVar18[3];
          pfVar18 = (float *)(bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar19 = iVar16;
          do {
            *pfVar18 = *pfVar18 * fVar9 + fVar4;
            pfVar18[1] = pfVar18[1] * fVar10 + fVar5;
            pfVar18[2] = pfVar18[2] * fVar11 + fVar7;
            pfVar18[3] = pfVar18[3] * fVar12 + fVar8;
            pfVar18 = pfVar18 + 4;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar14);
    }
  }
  else {
    if (iVar14 - 5U < 0xfffffffe) {
      iVar14 = BatchNorm::forward_inplace
                         ((BatchNorm *)
                          ((long)&this->_vptr_BatchNorm_x86 + (long)this->_vptr_BatchNorm_x86[-3]),
                          bottom_top_blob,opt);
      return iVar14;
    }
    pp_Var6 = this->_vptr_BatchNorm_x86;
    p_Var20 = pp_Var6[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var20)) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      lVar17 = 0;
      do {
        pfVar18 = (float *)(bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar4 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var20) + lVar17 * 4);
        fVar5 = *(float *)(*(long *)(&this->field_0x240 + (long)p_Var20) + lVar17 * 4);
        if ((int)uVar15 < 4) {
          uVar21 = 0;
        }
        else {
          iVar14 = 3;
          do {
            *pfVar18 = *pfVar18 * fVar5 + fVar4;
            pfVar18[1] = pfVar18[1] * fVar5 + fVar4;
            pfVar18[2] = pfVar18[2] * fVar5 + fVar4;
            pfVar18[3] = pfVar18[3] * fVar5 + fVar4;
            pfVar18 = pfVar18 + 4;
            iVar14 = iVar14 + 4;
            uVar21 = uVar15 & 0xfffffffc;
          } while (iVar14 < (int)uVar15);
        }
        if (uVar15 - uVar21 != 0 && (int)uVar21 <= (int)uVar15) {
          lVar23 = 0;
          do {
            pfVar18[lVar23] = pfVar18[lVar23] * fVar5 + fVar4;
            lVar23 = lVar23 + 1;
          } while (uVar15 - uVar21 != (int)lVar23);
        }
        lVar17 = lVar17 + 1;
        p_Var20 = pp_Var6[-3];
      } while (lVar17 < *(int *)(&this->field_0xd0 + (long)p_Var20));
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}